

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O3

Float __thiscall pbrt::PMJ02BNSampler::Get1D(PMJ02BNSampler *this)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined8 uVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  
  uVar2 = (this->pixel).super_Tuple2<pbrt::Point2,_int>.x;
  uVar3 = (this->pixel).super_Tuple2<pbrt::Point2,_int>.y;
  uVar4 = this->dimension;
  uVar10 = (long)*(int *)(Options + 4) ^
           (long)(int)uVar4 << 0x10 ^ (ulong)uVar3 << 0x20 ^ (ulong)uVar2 << 0x30;
  uVar10 = (uVar10 >> 0x1f ^ uVar10) * 0x7fb5d329728ea185;
  lVar11 = (uVar10 >> 0x1b ^ uVar10) * -0x7e25210b43d22bb3;
  uVar8 = this->sampleIndex;
  uVar9 = (uint)((ulong)lVar11 >> 0x21) ^ (uint)lVar11;
  uVar5 = this->samplesPerPixel;
  uVar12 = uVar5 - 1 >> 1 | uVar5 - 1;
  uVar12 = uVar12 >> 2 | uVar12;
  uVar12 = uVar12 >> 4 | uVar12;
  uVar12 = uVar12 >> 8 | uVar12;
  uVar12 = uVar12 >> 0x10 | uVar12;
  do {
    uVar8 = (uVar8 ^ uVar9) * -0x1e8f76c3 ^ uVar9 >> 0x10;
    uVar8 = ((uVar8 & uVar12) >> 4 ^ uVar9 >> 8 ^ uVar8) * 0x929eb3f ^ uVar9 >> 0x17;
    uVar8 = ((uVar8 & uVar12) >> 1 ^ uVar8) * (uVar9 >> 0x1b | 1) * 0x6935fa69;
    uVar8 = ((uVar8 & uVar12) >> 0xb ^ uVar8) * 0x74dcb303;
    uVar8 = ((uVar8 & uVar12) >> 2 ^ uVar8) * -0x61afe33d;
    uVar8 = ((uVar8 & uVar12) >> 2 ^ uVar8) * -0x379f5c21 & uVar12;
    uVar8 = uVar8 >> 5 ^ uVar8;
  } while (uVar5 <= uVar8);
  if (-1 < (int)(uVar2 | uVar3 | uVar4)) {
    uVar1 = *(ushort *)
             (BlueNoiseTextures +
             (ulong)(uVar3 & 0x7f) * 2 + (ulong)((uVar2 & 0x7f) << 8) + (ulong)(uVar4 % 0x30 << 0xf)
             );
    this->dimension = uVar4 + 1;
    auVar13._0_4_ =
         ((float)uVar1 / 65535.0 + (float)(int)((uVar8 + uVar9) % uVar5)) / (float)(int)uVar5;
    auVar13._4_12_ = SUB6012((undefined1  [60])0x0,0);
    uVar6 = vcmpss_avx512f(auVar13,ZEXT416(0x3f800000),9);
    bVar7 = (bool)((byte)uVar6 & 1);
    auVar13 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                         ZEXT416((uint)bVar7 * (int)auVar13._0_4_ +
                                 (uint)!bVar7 * (int)(auVar13._0_4_ + -1.0)));
    return auVar13._0_4_;
  }
  LogFatal<char_const(&)[40]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/bluenoise.h"
             ,0x17,"Check failed: %s",(char (*) [40])"textureIndex >= 0 && px >= 0 && py >= 0");
}

Assistant:

PBRT_CPU_GPU
    Float Get1D() {
        uint64_t hash = MixBits(((uint64_t)pixel.x << 48) ^ ((uint64_t)pixel.y << 32) ^
                                ((uint64_t)dimension << 16) ^ GetOptions().seed);

        int index = PermutationElement(sampleIndex, samplesPerPixel, hash);
        Float cpOffset = BlueNoise(dimension, pixel.x, pixel.y);
        Float u = (index + cpOffset) / samplesPerPixel;
        if (u >= 1)
            u -= 1;
        ++dimension;
        return std::min(u, OneMinusEpsilon);
    }